

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_hc_perceptual
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint16 uVar4;
  dxt1_solution_coordinates dVar5;
  ulong uVar6;
  uint16 uVar7;
  undefined7 in_register_00000011;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int result;
  uint uVar18;
  ulong uVar19;
  int result_1;
  uint uVar20;
  unique_color *puVar21;
  int result_2;
  uint uVar22;
  bool bVar23;
  color_quad_u8 c1;
  color_quad_u8 c0;
  uint local_70;
  uint local_60;
  uint local_58;
  uint local_48;
  uint local_40;
  dxt1_block local_38;
  
  dxt1_block::unpack_color((dxt1_block *)local_38.m_selectors,coords->m_low_color,true,0xff);
  dxt1_block::unpack_color(&local_38,coords->m_high_color,true,0xff);
  iVar11 = (int)CONCAT71(in_register_00000011,alternate_rounding);
  uVar10 = (uint)((ulong)((uint)local_38.m_low_color[0] + iVar11 + (uint)local_38.m_selectors[0] * 2
                         ) * 0x55555556 >> 0x20);
  if (0xfe < uVar10) {
    uVar10 = 0xff;
  }
  uVar12 = (uint)((ulong)((uint)local_38.m_low_color[1] + iVar11 + (uint)local_38.m_selectors[1] * 2
                         ) * 0x55555556 >> 0x20);
  if (0xfe < uVar12) {
    uVar12 = 0xff;
  }
  uVar18 = (uint)((ulong)((uint)local_38.m_high_color[0] + iVar11 +
                         (uint)local_38.m_selectors[2] * 2) * 0x55555556 >> 0x20);
  if (0xfe < uVar18) {
    uVar18 = 0xff;
  }
  uVar20 = (uint)((ulong)((uint)local_38.m_selectors[0] + iVar11 + (uint)local_38.m_low_color[0] * 2
                         ) * 0x55555556 >> 0x20);
  if (0xfe < uVar20) {
    uVar20 = 0xff;
  }
  uVar22 = (uint)((ulong)((uint)local_38.m_selectors[1] + iVar11 + (uint)local_38.m_low_color[1] * 2
                         ) * 0x55555556 >> 0x20);
  if (0xfe < uVar22) {
    uVar22 = 0xff;
  }
  uVar14 = (uint)((ulong)((uint)local_38.m_selectors[2] + iVar11 +
                         (uint)local_38.m_high_color[0] * 2) * 0x55555556 >> 0x20);
  uVar9 = 0xff;
  if (uVar14 < 0xff) {
    uVar9 = uVar14;
  }
  uVar8 = (this->m_evaluated_colors).m_size;
  if (uVar8 == 0) {
    uVar19 = 0;
  }
  else {
    puVar21 = (this->m_evaluated_colors).m_p;
    uVar19 = 0;
    do {
      bVar1 = (puVar21->m_color).field_0.field_0.r;
      bVar2 = (puVar21->m_color).field_0.field_0.g;
      bVar3 = (puVar21->m_color).field_0.field_0.b;
      local_40 = (uint)local_38.m_selectors[0];
      iVar13 = bVar1 - local_40;
      local_58 = (uint)local_38.m_selectors[1];
      iVar11 = bVar2 - local_58;
      local_70 = (uint)local_38.m_selectors[2];
      iVar15 = bVar3 - local_70;
      uVar16 = iVar15 * iVar15 + iVar11 * iVar11 * 0x19 + iVar13 * iVar13 * 8;
      local_48 = (uint)local_38.m_low_color[0];
      iVar11 = bVar1 - local_48;
      local_60 = (uint)local_38.m_low_color[1];
      iVar13 = bVar2 - local_60;
      iVar15 = (uint)bVar3 - (uint)local_38.m_high_color[0];
      uVar14 = iVar15 * iVar15 + iVar13 * iVar13 * 0x19 + iVar11 * iVar11 * 8;
      if (uVar16 < uVar14) {
        uVar14 = uVar16;
      }
      iVar11 = bVar1 - uVar10;
      iVar13 = bVar2 - uVar12;
      iVar15 = bVar3 - uVar18;
      uVar17 = iVar15 * iVar15 + iVar13 * iVar13 * 0x19 + iVar11 * iVar11 * 8;
      iVar15 = bVar1 - uVar20;
      iVar13 = bVar2 - uVar22;
      iVar11 = bVar3 - uVar9;
      uVar16 = iVar11 * iVar11 + iVar13 * iVar13 * 0x19 + iVar15 * iVar15 * 8;
      if (uVar17 < uVar16) {
        uVar16 = uVar17;
      }
      if (uVar14 < uVar16) {
        uVar16 = uVar14;
      }
      uVar19 = (ulong)puVar21->m_weight * (ulong)uVar16 + uVar19;
      if (uVar19 < (this->m_best_solution).m_error) {
        uVar8 = uVar8 - 1;
      }
      else {
        uVar8 = 0;
      }
      puVar21 = puVar21 + 1;
    } while (uVar8 != 0);
  }
  uVar6 = (this->m_best_solution).m_error;
  if (uVar19 < uVar6) {
    dVar5 = *coords;
    (this->m_best_solution).m_coords = dVar5;
    (this->m_best_solution).m_error = uVar19;
    (this->m_best_solution).m_alpha_block = false;
    (this->m_best_solution).m_alternate_rounding = alternate_rounding;
    uVar4 = (this->m_best_solution).m_coords.m_high_color;
    uVar7 = dVar5.m_low_color;
    (this->m_best_solution).m_enforce_selector = uVar7 == uVar4;
    if (uVar7 == uVar4) {
      bVar23 = (~(uint)dVar5 & 0x1f) != 0;
      if (bVar23) {
        (this->m_best_solution).m_coords.m_low_color = uVar7 + 1;
      }
      else {
        (this->m_best_solution).m_coords.m_high_color = uVar4 - 1;
      }
      (this->m_best_solution).m_enforced_selector = bVar23;
    }
  }
  return uVar19 < uVar6;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_hc_perceptual(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        color_quad_u8 c0 = dxt1_block::unpack_color(coords.m_low_color, true);
        color_quad_u8 c1 = dxt1_block::unpack_color(coords.m_high_color, true);
        color_quad_u8 c2((c0.r * 2 + c1.r + alternate_rounding) / 3, (c0.g * 2 + c1.g + alternate_rounding) / 3, (c0.b * 2 + c1.b + alternate_rounding) / 3, 0);
        color_quad_u8 c3((c1.r * 2 + c0.r + alternate_rounding) / 3, (c1.g * 2 + c0.g + alternate_rounding) / 3, (c1.b * 2 + c0.b + alternate_rounding) / 3, 0);
        uint64 error = 0;
        unique_color* color = m_evaluated_colors.get_ptr();
        for (uint count = m_evaluated_colors.size(); count; color++, error < m_best_solution.m_error ? count-- : count = 0)
        {
            uint e01 = math::minimum(color::color_distance(true, color->m_color, c0, false), color::color_distance(true, color->m_color, c1, false));
            uint e23 = math::minimum(color::color_distance(true, color->m_color, c2, false), color::color_distance(true, color->m_color, c3, false));
            error += math::minimum(e01, e23) * (uint64)color->m_weight;
        }
        if (error >= m_best_solution.m_error)
        {
            return false;
        }
        m_best_solution.m_coords = coords;
        m_best_solution.m_error = error;
        m_best_solution.m_alpha_block = false;
        m_best_solution.m_alternate_rounding = alternate_rounding;
        m_best_solution.m_enforce_selector = m_best_solution.m_coords.m_low_color == m_best_solution.m_coords.m_high_color;
        if (m_best_solution.m_enforce_selector)
        {
            if ((m_best_solution.m_coords.m_low_color & 31) != 31)
            {
                m_best_solution.m_coords.m_low_color++;
                m_best_solution.m_enforced_selector = 1;
            }
            else
            {
                m_best_solution.m_coords.m_high_color--;
                m_best_solution.m_enforced_selector = 0;
            }
        }
        return true;
    }